

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::ComputeDefines
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *headTarget;
  int iVar2;
  cmGlobalNinjaGenerator *pcVar3;
  cmValue cVar4;
  string *psVar5;
  string COMPILE_DEFINITIONS;
  string defPropName;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmGeneratorExpressionInterpreter genexInterpreter;
  string local_210;
  string *local_1f0;
  string local_1e8;
  string local_1c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  cmAlphaNum local_f8;
  cmGeneratorExpressionInterpreter local_c8;
  cmAlphaNum local_60;
  
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a8._M_impl.super__Rb_tree_header._M_header;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar1 = this->LocalGenerator;
  local_1f0 = __return_storage_ptr__;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&local_118,(string *)config);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string((string *)&local_138,(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_c8,(cmLocalGenerator *)pcVar1,&local_118,headTarget,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  pcVar3 = GetGlobalGenerator(this);
  iVar2 = (*(pcVar3->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x26])(pcVar3);
  if ((char)iVar2 != '\0') {
    local_f8.View_._M_len = 0xe;
    local_f8.View_._M_str = "CMAKE_INTDIR=\"";
    local_60.View_._M_str = (config->_M_dataplus)._M_p;
    local_60.View_._M_len = config->_M_string_length;
    local_1c8._M_dataplus._M_p._0_1_ = 0x22;
    cmStrCat<char>(&local_210,&local_f8,&local_60,(char *)&local_1c8);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_1a8,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"COMPILE_DEFINITIONS",(allocator<char> *)&local_f8);
  cVar4 = cmSourceFile::GetProperty(source,&local_210);
  if (cVar4.Value != (string *)0x0) {
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_158,(string *)cVar4.Value);
    psVar5 = cmGeneratorExpressionInterpreter::Evaluate(&local_c8,&local_158,&local_210);
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1a8,psVar5);
    std::__cxx11::string::~string((string *)&local_158);
  }
  local_f8.View_._M_len = 0x14;
  local_f8.View_._M_str = "COMPILE_DEFINITIONS_";
  cmsys::SystemTools::UpperCase(&local_1e8,config);
  local_60.View_._M_len = local_1e8._M_string_length;
  local_60.View_._M_str = local_1e8._M_dataplus._M_p;
  cmStrCat<>(&local_1c8,&local_f8,&local_60);
  std::__cxx11::string::~string((string *)&local_1e8);
  cVar4 = cmSourceFile::GetProperty(source,&local_1c8);
  if (cVar4.Value != (string *)0x0) {
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_178,(string *)cVar4.Value);
    psVar5 = cmGeneratorExpressionInterpreter::Evaluate(&local_c8,&local_178,&local_210);
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1a8,psVar5);
    std::__cxx11::string::~string((string *)&local_178);
  }
  psVar5 = local_1f0;
  cmCommonTargetGenerator::GetDefines
            (local_1f0,&this->super_cmCommonTargetGenerator,language,config);
  cmLocalGenerator::JoinDefines
            ((cmLocalGenerator *)this->LocalGenerator,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1a8,psVar5,language);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_210);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&local_c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1a8);
  return psVar5;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeDefines(cmSourceFile const* source,
                                                   const std::string& language,
                                                   const std::string& config)
{
  std::set<std::string> defines;
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  // Seriously??
  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    defines.insert(cmStrCat("CMAKE_INTDIR=\"", config, '"'));
  }

  const std::string COMPILE_DEFINITIONS("COMPILE_DEFINITIONS");
  if (cmValue compile_defs = source->GetProperty(COMPILE_DEFINITIONS)) {
    this->LocalGenerator->AppendDefines(
      defines, genexInterpreter.Evaluate(*compile_defs, COMPILE_DEFINITIONS));
  }

  std::string defPropName =
    cmStrCat("COMPILE_DEFINITIONS_", cmSystemTools::UpperCase(config));
  if (cmValue config_compile_defs = source->GetProperty(defPropName)) {
    this->LocalGenerator->AppendDefines(
      defines,
      genexInterpreter.Evaluate(*config_compile_defs, COMPILE_DEFINITIONS));
  }

  std::string definesString = this->GetDefines(language, config);
  this->LocalGenerator->JoinDefines(defines, definesString, language);

  return definesString;
}